

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

void __thiscall
vkt::SpirVAssembly::ConvertCase::ConvertCase
          (ConvertCase *this,IntegerType from,IntegerType to,deInt64 number)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  ComputeTestFeatures CVar2;
  mapped_type *pmVar3;
  IntegerType to_00;
  IntegerType type;
  string *this_01;
  BufferSp BVar4;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string local_a0;
  key_type local_80;
  BufferSp *local_60;
  string *local_58;
  key_type local_50;
  
  to_00 = (IntegerType)number;
  this->m_fromType = from;
  this->m_toType = to;
  CVar2 = getConversionUsedFeatures(from,to);
  this->m_features = CVar2;
  local_58 = &this->m_name;
  getTestName_abi_cxx11_(local_58,(SpirVAssembly *)(ulong)from,to,to_00);
  (this->m_asmTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_asmTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this_00 = &this->m_asmTypes;
  p_Var1 = &(this->m_asmTypes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_asmTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_asmTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_asmTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = &this->m_inputBuffer;
  getBuffer((SpirVAssembly *)local_60,from,number);
  BVar4 = getBuffer((SpirVAssembly *)&this->m_outputBuffer,to,number);
  getAsmTypeDeclaration_abi_cxx11_
            (&local_a0,(SpirVAssembly *)(ulong)from,(IntegerType)BVar4.m_state);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"inputType",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_80);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  getAsmTypeDeclaration_abi_cxx11_(&local_a0,(SpirVAssembly *)(ulong)to,type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"outputType",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_80);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  CVar2 = this->m_features;
  if (CVar2 == COMPUTE_TEST_USES_INT16_INT64) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"OpCapability Int16\n",&local_a1);
    std::operator+(&local_a0,&local_80,"OpCapability Int64\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"int_capabilities",&local_a2);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_50);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a0);
    this_01 = &local_80;
  }
  else {
    if (CVar2 == COMPUTE_TEST_USES_INT64) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"int_capabilities",(allocator<char> *)&local_80);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_a0);
      std::__cxx11::string::assign((char *)pmVar3);
    }
    else {
      if (CVar2 != COMPUTE_TEST_USES_INT16) {
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"int_capabilities",(allocator<char> *)&local_80);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_a0);
      std::__cxx11::string::assign((char *)pmVar3);
    }
    this_01 = &local_a0;
  }
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

ConvertCase (IntegerType from, IntegerType to, deInt64 number)
	: m_fromType		(from)
	, m_toType			(to)
	, m_features		(getConversionUsedFeatures(from, to))
	, m_name			(getTestName(from, to))
	, m_inputBuffer		(getBuffer(from, number))
	, m_outputBuffer	(getBuffer(to, number))
	{
		m_asmTypes["inputType"]		= getAsmTypeDeclaration(from);
		m_asmTypes["outputType"]	= getAsmTypeDeclaration(to);

		if (m_features == COMPUTE_TEST_USES_INT16)
		{
			m_asmTypes["int_capabilities"] = "OpCapability Int16\n";
		}
		else if (m_features == COMPUTE_TEST_USES_INT64)
		{
			m_asmTypes["int_capabilities"] = "OpCapability Int64\n";
		}
		else if (m_features == COMPUTE_TEST_USES_INT16_INT64)
		{
			m_asmTypes["int_capabilities"] = string("OpCapability Int16\n") +
													"OpCapability Int64\n";
		}
		else
		{
			DE_ASSERT(false);
		}
	}